

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::AddString(cmCommandArgumentParserHelper *this,string *str)

{
  ulong uVar1;
  long lVar2;
  cmCommandArgumentParserHelper *__dest;
  char *__src;
  cmCommandArgumentParserHelper *local_28;
  char *stVal;
  string *str_local;
  cmCommandArgumentParserHelper *this_local;
  
  stVal = (char *)str;
  str_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  this_local = this;
  if ((uVar1 & 1) == 0) {
    lVar2 = std::__cxx11::string::size();
    __dest = (cmCommandArgumentParserHelper *)operator_new__(lVar2 + 1);
    local_28 = __dest;
    __src = (char *)std::__cxx11::string::c_str();
    strcpy((char *)__dest,__src);
    std::vector<char_*,_std::allocator<char_*>_>::push_back
              (&this->Variables,(value_type *)&local_28);
    this_local = local_28;
  }
  return this_local->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::AddString(const std::string& str)
{
  if (str.empty()) {
    return this->EmptyVariable;
  }
  char* stVal = new char[str.size() + 1];
  strcpy(stVal, str.c_str());
  this->Variables.push_back(stVal);
  return stVal;
}